

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::ProjectionProfile
          (ProjectionProfileForm4 projectionProfile,Image *image,bool horizontal)

{
  uint32_t uVar1;
  uint32_t uVar2;
  byte in_CL;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *projection;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  
  pvVar3 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10e252);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_RDX,0,0,uVar1,uVar2,in_CL & 1,pvVar3);
  return in_RDI;
}

Assistant:

std::vector < uint32_t > ProjectionProfile( FunctionTable::ProjectionProfileForm4 projectionProfile,
                                                const Image & image, bool horizontal )
    {
        std::vector < uint32_t > projection;

        projectionProfile( image, 0, 0, image.width(), image.height(), horizontal, projection );

        return projection;
    }